

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O1

int32 print_counts(char *countfn,phnhashelement_t **CIhash,hashelement_t **CDhash)

{
  FILE *__stream;
  heapelement_t *phVar1;
  char *pcVar2;
  int32 iVar3;
  phnhashelement_t *ppVar4;
  long lVar5;
  hashelement_t *phVar6;
  int32 ciheapsize;
  int32 cdheapsize;
  heapelement_t **CIheap;
  heapelement_t **CDheap;
  int32 local_58;
  int32 local_54;
  heapelement_t **local_50;
  heapelement_t **local_48;
  FILE *local_40;
  hashelement_t **local_38;
  
  local_48 = (heapelement_t **)0x0;
  local_50 = (heapelement_t **)0x0;
  local_38 = CDhash;
  local_40 = fopen(countfn,"w");
  if (local_40 == (FILE *)0x0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x2b8,"Unable to open %s for writing. Not writing counts!\n",countfn);
    iVar3 = -1;
  }
  else {
    fwrite("base\tleft\tright\twdpos\tcount\n",0x1c,1,local_40);
    local_58 = 0;
    lVar5 = 0;
    do {
      for (ppVar4 = CIhash[lVar5]; __stream = local_40, ppVar4 != (phnhashelement_t *)0x0;
          ppVar4 = ppVar4->next) {
        if (0 < ppVar4->count) {
          phVar1 = (heapelement_t *)
                   __ckd_calloc__(1,0x28,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                  ,0x2c5);
          pcVar2 = strdup(ppVar4->phone);
          phVar1->basephone = pcVar2;
          phVar1->count = ppVar4->count;
          local_58 = insert(&local_50,local_58,phVar1);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x65);
    if (0 < local_58) {
      iVar3 = local_58;
      do {
        phVar1 = yanktop(&local_50,local_58,&local_58);
        fprintf(__stream,"%s\t-\t-\t-\t%d\n",phVar1->basephone,(ulong)(uint)phVar1->count);
        free_heapelement(phVar1);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    local_54 = 0;
    lVar5 = 0;
    do {
      for (phVar6 = local_38[lVar5]; phVar6 != (hashelement_t *)0x0; phVar6 = phVar6->next) {
        if (0 < phVar6->count) {
          phVar1 = (heapelement_t *)
                   __ckd_calloc__(1,0x28,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                  ,0x2db);
          pcVar2 = strdup(phVar6->basephone);
          phVar1->basephone = pcVar2;
          pcVar2 = strdup(phVar6->leftcontext);
          phVar1->leftcontext = pcVar2;
          pcVar2 = strdup(phVar6->rightcontext);
          phVar1->rightcontext = pcVar2;
          pcVar2 = strdup(phVar6->wordposition);
          phVar1->wordposition = pcVar2;
          phVar1->count = phVar6->count;
          local_54 = insert(&local_48,local_54,phVar1);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x5dc1);
    if (0 < local_54) {
      iVar3 = local_54;
      do {
        phVar1 = yanktop(&local_48,local_54,&local_54);
        fprintf(__stream,"%s\t%s\t%s\t%s\t%d\n",phVar1->basephone,phVar1->leftcontext,
                phVar1->rightcontext,phVar1->wordposition,phVar1->count);
        free_heapelement(phVar1);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    fclose(__stream);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int32   print_counts(const char *countfn, phnhashelement_t  **CIhash,
		     hashelement_t **CDhash)
{
    heapelement_t **CDheap=NULL, **CIheap=NULL, *addphone, *addtriphone;
    hashelement_t *triphone_el; 
    phnhashelement_t *ciphone_el;
    int32 i, heapsize,cdheapsize,ciheapsize;
    FILE  *ofp;

    if ((ofp = fopen(countfn,"w")) == NULL){
	E_WARN("Unable to open %s for writing. Not writing counts!\n",countfn);
        return S3_ERROR;
    }
    fprintf(ofp,"base\tleft\tright\twdpos\tcount\n");

    ciheapsize = 0;
    for (i = 0; i < PHNHASHSIZE; i++){
	ciphone_el = CIhash[i];
	while (ciphone_el != NULL){
	    if (ciphone_el->count < 1) {
		ciphone_el = ciphone_el->next;
		continue;
	    }
	    addphone = (heapelement_t *) ckd_calloc(1,sizeof(heapelement_t));
	    addphone->basephone = strdup(ciphone_el->phone);
	    addphone->count = ciphone_el->count;
	    ciheapsize = insert(&CIheap, ciheapsize, addphone);
	    ciphone_el = ciphone_el->next;
        }
    }
    heapsize = ciheapsize;
    for (i = 0; i < heapsize; i++) {
        addphone = yanktop(&CIheap,ciheapsize,&ciheapsize);
	fprintf(ofp,"%s\t-\t-\t-\t%d\n",addphone->basephone,addphone->count);
	free_heapelement(addphone);
    }

    cdheapsize = 0;
    for (i = 0; i < HASHSIZE; i++){
	triphone_el = CDhash[i];
	while (triphone_el != NULL){
	    if (triphone_el->count < 1) {
		triphone_el = triphone_el->next;
		continue;
	    }
	    addtriphone = (heapelement_t *) ckd_calloc(1,sizeof(heapelement_t));
	    addtriphone->basephone = strdup(triphone_el->basephone);
	    addtriphone->leftcontext = strdup(triphone_el->leftcontext);
	    addtriphone->rightcontext = strdup(triphone_el->rightcontext);
	    addtriphone->wordposition = strdup(triphone_el->wordposition);
	    addtriphone->count = triphone_el->count;
	    cdheapsize = insert(&CDheap, cdheapsize, addtriphone);
	    triphone_el = triphone_el->next;
        }
    }
    heapsize = cdheapsize;
    for (i = 0; i < heapsize; i++) {
        addtriphone = yanktop(&CDheap,cdheapsize,&cdheapsize);
	fprintf(ofp,"%s\t%s\t%s\t%s\t%d\n",addtriphone->basephone,
					   addtriphone->leftcontext,
					   addtriphone->rightcontext,
					   addtriphone->wordposition,
					   addtriphone->count);
	free_heapelement(addtriphone);
    }
    fclose(ofp);
    return S3_SUCCESS;
}